

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O3

void nn_cipc_start_connecting(nn_cipc *self)

{
  nn_usock *self_00;
  int iVar1;
  char *__s;
  size_t sVar2;
  int val;
  size_t sz;
  undefined1 local_ac [4];
  size_t local_a8;
  sockaddr local_a0 [6];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  self_00 = &self->usock;
  iVar1 = nn_usock_start(self_00,1,1,0);
  if (iVar1 < 0) {
    nn_backoff_start(&self->retry);
    self->state = 6;
    return;
  }
  local_a8 = 4;
  nn_ep_getopt(self->ep,0,2,local_ac,&local_a8);
  if (local_a8 == 4) {
    nn_usock_setsockopt(self_00,1,7,local_ac,4);
    local_a8 = 4;
    nn_ep_getopt(self->ep,0,3,local_ac,&local_a8);
    if (local_a8 == 4) {
      nn_usock_setsockopt(self_00,1,8,local_ac,4);
      __s = nn_ep_getaddr(self->ep);
      local_38 = 0;
      uStack_30 = 0;
      local_28 = 0;
      sVar2 = strlen(__s);
      if (sVar2 < 0x6c) {
        local_a0[0].sa_family = 1;
        strncpy(local_a0[0].sa_data,__s,0x6c);
        nn_usock_connect(self_00,local_a0,0x6e);
        self->state = 2;
        nn_ep_stat_increment(self->ep,0xca,1);
        return;
      }
      goto LAB_00135342;
    }
  }
  else {
    nn_cipc_start_connecting_cold_1();
  }
  nn_cipc_start_connecting_cold_2();
LAB_00135342:
  nn_cipc_start_connecting_cold_3();
}

Assistant:

static void nn_cipc_start_connecting (struct nn_cipc *self)
{
    int rc;
    struct sockaddr_storage ss;
    struct sockaddr_un *un;
    const char *addr;
    int val;
    size_t sz;

    /*  Try to start the underlying socket. */
    rc = nn_usock_start (&self->usock, AF_UNIX, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CIPC_STATE_WAITING;
        return;
    }

    /*  Set the relevant socket options. */
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_SNDBUF,
        &val, sizeof (val));
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_RCVBUF,
        &val, sizeof (val));

    /*  Create the IPC address from the address string. */
    addr = nn_ep_getaddr (self->ep);
    memset (&ss, 0, sizeof (ss));
    un = (struct sockaddr_un*) &ss;
    nn_assert (strlen (addr) < sizeof (un->sun_path));
    ss.ss_family = AF_UNIX;
    strncpy (un->sun_path, addr, sizeof (un->sun_path));

#if defined NN_HAVE_WINDOWS
    /* Get/Set security attribute pointer*/
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_SEC_ATTR, &self->usock.sec_attr, &sz);

    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_OUTBUFSZ, &self->usock.outbuffersz, &sz);
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_INBUFSZ, &self->usock.inbuffersz, &sz);
#endif

    /*  Start connecting. */
    nn_usock_connect (&self->usock, (struct sockaddr*) &ss,
        sizeof (struct sockaddr_un));
    self->state  = NN_CIPC_STATE_CONNECTING;

    nn_ep_stat_increment (self->ep, NN_STAT_INPROGRESS_CONNECTIONS, 1);
}